

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_lyb.c
# Opt level: O2

int lyb_write(lyout *out,uint8_t *buf,size_t count,lyb_state *lybs)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  uint8_t *local_50;
  char local_32;
  uint8_t local_31;
  uint8_t meta_buf [2];
  
  if ((out == (lyout *)0x0) || (lybs == (lyb_state *)0x0)) {
    __assert_fail("out && lybs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_lyb.c"
                  ,0x147,
                  "int lyb_write(struct lyout *, const uint8_t *, size_t, struct lyb_state *)");
  }
  iVar3 = 0;
  local_50 = buf;
  while( true ) {
    do {
      uVar5 = (ulong)(uint)lybs->used;
      if (lybs->used < 1) {
        uVar5 = 0;
      }
      uVar9 = 0xffffffffffffffff;
      uVar7 = count;
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        bVar10 = 0xfe < lybs->written[uVar6] + uVar7;
        if (bVar10) {
          uVar9 = uVar6;
        }
        uVar9 = uVar9 & 0xffffffff;
        if (bVar10) {
          uVar7 = 0xff - lybs->written[uVar6];
        }
      }
      if (((int)uVar9 == -1) && (count == 0)) {
        return iVar3;
      }
      if (uVar7 != 0) {
        iVar2 = ly_write(out,(char *)local_50,uVar7);
        uVar5 = (ulong)iVar2;
        if (uVar5 < uVar7) {
          return -1;
        }
        uVar7 = (ulong)(uint)lybs->used;
        if (lybs->used < 1) {
          uVar7 = 0;
        }
        uVar6 = 0;
        while (uVar7 != uVar6) {
          uVar8 = lybs->written[uVar6] + uVar5;
          lybs->written[uVar6] = uVar8;
          uVar6 = uVar6 + 1;
          if (0xff < uVar8) {
            __assert_fail("lybs->written[i] <= LYB_SIZE_MAX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_lyb.c"
                          ,0x164,
                          "int lyb_write(struct lyout *, const uint8_t *, size_t, struct lyb_state *)"
                         );
          }
        }
        count = count - uVar5;
        local_50 = local_50 + uVar5;
        iVar3 = iVar2 + iVar3;
      }
    } while ((int)uVar9 < 0);
    uVar9 = uVar9 & 0xffffffff;
    local_32 = (char)lybs->written[uVar9];
    local_31 = lybs->inner_chunks[uVar9];
    uVar4 = ly_write_skipped(out,lybs->position[uVar9],&local_32,2);
    if (uVar4 < 2) {
      return -1;
    }
    lybs->written[uVar9] = 0;
    lybs->inner_chunks[uVar9] = '\0';
    uVar4 = ly_write_skip(out,2,lybs->position + uVar9);
    if (uVar4 < 2) break;
    iVar3 = iVar3 + uVar4;
    for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
      uVar1 = lybs->inner_chunks[uVar5];
      if (uVar1 == 0xff) {
        ly_log(lybs->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/printer_lyb.c"
               ,0x186);
        return -1;
      }
      lybs->inner_chunks[uVar5] = uVar1 + '\x01';
    }
  }
  return -1;
}

Assistant:

static int
lyb_write(struct lyout *out, const uint8_t *buf, size_t count, struct lyb_state *lybs)
{
    int ret = 0, i, full_chunk_i;
    size_t r, to_write;
    uint8_t meta_buf[LYB_META_BYTES];

    assert(out && lybs);

    while (1) {
        /* check for full data chunks */
        to_write = count;
        full_chunk_i = -1;
        for (i = 0; i < lybs->used; ++i) {
            /* we want the innermost chunks resolved first, so replace previous full chunks */
            if (lybs->written[i] + to_write >= LYB_SIZE_MAX) {
                /* full chunk, do not write more than allowed */
                to_write = LYB_SIZE_MAX - lybs->written[i];
                full_chunk_i = i;
            }
        }

        if ((full_chunk_i == -1) && !count) {
            break;
        }

        /* we are actually writing some data, not just finishing another chunk */
        if (to_write) {
            r = ly_write(out, (char *)buf, to_write);
            if (r < to_write) {
                return -1;
            }

            for (i = 0; i < lybs->used; ++i) {
                /* increase all written counters */
                lybs->written[i] += r;
                assert(lybs->written[i] <= LYB_SIZE_MAX);
            }
            /* decrease count/buf */
            count -= r;
            buf += r;

            ret += r;
        }

        if (full_chunk_i > -1) {
            /* write the meta information (inner chunk count and chunk size) */
            meta_buf[0] = lybs->written[full_chunk_i] & 0xFF;
            meta_buf[1] = lybs->inner_chunks[full_chunk_i] & 0xFF;

            r = ly_write_skipped(out, lybs->position[full_chunk_i], (char *)meta_buf, LYB_META_BYTES);
            if (r < LYB_META_BYTES) {
                return -1;
            }

            /* zero written and inner chunks */
            lybs->written[full_chunk_i] = 0;
            lybs->inner_chunks[full_chunk_i] = 0;

            /* skip space for another chunk size */
            r = ly_write_skip(out, LYB_META_BYTES, &lybs->position[full_chunk_i]);
            if (r < LYB_META_BYTES) {
                return -1;
            }

            ret += r;

            /* increase inner chunk count */
            for (i = 0; i < full_chunk_i; ++i) {
                if (lybs->inner_chunks[i] == LYB_INCHUNK_MAX) {
                    LOGINT(lybs->ctx);
                    return -1;
                }
                ++lybs->inner_chunks[i];
            }
        }
    }

    return ret;
}